

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void MatchFinder_Init(void *_p)

{
  CMatchFinder *p;
  void *_p_local;
  
  MatchFinder_Init_HighHash((CMatchFinder *)_p);
  MatchFinder_Init_LowHash((CMatchFinder *)_p);
  MatchFinder_Init_4((CMatchFinder *)_p);
  MatchFinder_ReadBlock((CMatchFinder *)_p);
  *(undefined4 *)((long)_p + 0x18) = *(undefined4 *)((long)_p + 8);
  MatchFinder_SetLimits((CMatchFinder *)_p);
  return;
}

Assistant:

void MatchFinder_Init(void *_p)
{
  CMatchFinder *p = (CMatchFinder *)_p;
  MatchFinder_Init_HighHash(p);
  MatchFinder_Init_LowHash(p);
  MatchFinder_Init_4(p);
  // if (readData)
  MatchFinder_ReadBlock(p);

  /* if we init (cyclicBufferPos = pos), then we can use one variable
     instead of both (cyclicBufferPos) and (pos) : only before (cyclicBufferPos) wrapping */
  p->cyclicBufferPos = (p->pos - CYC_TO_POS_OFFSET); // init with relation to (pos)
  // p->cyclicBufferPos = 0; // smallest value
  // p->son[0] = p->son[1] = 0; // unused: we can init skipped record for speculated accesses.
  MatchFinder_SetLimits(p);
}